

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LightMask.hpp
# Opt level: O2

void __thiscall LightMask::forwardProp(LightMask *this,vector<float,_std::allocator<float>_> *walls)

{
  uint uVar1;
  ulong uVar2;
  int iVar3;
  pointer pfVar4;
  int iVar5;
  int iVar6;
  int x;
  int iVar7;
  long lVar8;
  float fVar9;
  
  for (lVar8 = 1; uVar2 = (ulong)this->width_, lVar8 < (long)uVar2; lVar8 = lVar8 + 1) {
    pfVar4 = (this->mask).super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_start;
    fVar9 = computeIntensity(this,pfVar4[lVar8],pfVar4[lVar8 + -1],0.0,
                             (walls->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                             super__Vector_impl_data._M_start[lVar8]);
    (this->mask).super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_start[lVar8] = fVar9;
  }
  iVar5 = 0;
  for (iVar7 = 1; iVar7 < this->height_; iVar7 = iVar7 + 1) {
    iVar3 = (int)uVar2 * iVar7;
    pfVar4 = (this->mask).super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_start;
    fVar9 = computeIntensity(this,pfVar4[iVar3],pfVar4[(iVar7 + -1) * (int)uVar2],0.0,
                             (walls->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                             super__Vector_impl_data._M_start[iVar3]);
    uVar1 = this->width_;
    pfVar4 = (this->mask).super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_start;
    pfVar4[(int)(uVar1 * iVar7)] = fVar9;
    lVar8 = 1;
    while( true ) {
      uVar2 = (ulong)uVar1;
      iVar3 = (int)lVar8;
      if ((int)uVar1 <= iVar3) break;
      iVar6 = iVar7 * uVar1 + iVar3;
      fVar9 = computeIntensity(this,pfVar4[iVar6],pfVar4[(int)(iVar7 * uVar1 + iVar3 + -1)],
                               pfVar4[(int)(uVar1 * iVar5 + iVar3)],
                               (walls->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                               super__Vector_impl_data._M_start[iVar6]);
      uVar1 = this->width_;
      pfVar4 = (this->mask).super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_start;
      pfVar4[(int)(iVar7 * uVar1) + lVar8] = fVar9;
      lVar8 = lVar8 + 1;
    }
    iVar5 = iVar5 + 1;
  }
  return;
}

Assistant:

void forwardProp(const std::vector<float>& walls)
    {
        for (int x = 1; x < width_; x++)
        {
            // Only compare to pixel on the left
            mask[idx(x,0)] = computeIntensity(mask[idx(x,0)], mask[idx(x-1, 0)], 0.0f, walls[idx(x,0)]);
        }
        for (int y = 1; y < height_; y++)
        {
            // First pixel
            // Only compare to pixel above
            mask[idx(0,y)] = computeIntensity(mask[idx(0,y)], mask[idx(0, y-1)], 0.0f, walls[idx(0,y)] );

            // All other pixels: compare to pixel above and to the left
            for (int x = 1; x < width_; x++)
            {
                mask[idx(x,y)] = computeIntensity(
                        mask[ idx(x,   y)],
                        mask[ idx(x-1, y)],
                        mask[ idx(x,   y-1)],
                        walls[idx(x,   y)] );
            }
        }
    }